

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O2

void __thiscall
chrono::ChTimestepperEulerExplIIorder::Advance(ChTimestepperEulerExplIIorder *this,double dt)

{
  ChState *y;
  ChStateDelta *this_00;
  ChStateDelta *this_01;
  ChVectorDynamic<> *this_02;
  double *pdVar1;
  ChIntegrable *pCVar2;
  ChIntegrable *pCVar3;
  int iVar4;
  ChStateDelta local_90;
  ChVectorDynamic<> *local_78;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_70;
  ChStateDelta local_48;
  
  pCVar2 = (this->super_ChTimestepperIIorder).super_ChTimestepper.integrable;
  y = &(this->super_ChTimestepperIIorder).X;
  this_00 = &(this->super_ChTimestepperIIorder).V;
  this_01 = &(this->super_ChTimestepperIIorder).A;
  (*pCVar2->_vptr_ChIntegrable[0x15])(pCVar2,y,this_00);
  iVar4 = (*pCVar2->_vptr_ChIntegrable[0x13])(pCVar2);
  pCVar3 = (this->super_ChTimestepperIIorder).super_ChTimestepper.integrable;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Dv,(long)iVar4);
  (this->Dv).integrable = pCVar3;
  this_02 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.L;
  iVar4 = (*pCVar2->_vptr_ChIntegrable[2])(pCVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&this_02->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar4);
  pdVar1 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.T;
  (*pCVar2->_vptr_ChIntegrable[0x16])(pCVar2,y,this_00,pdVar1);
  local_78 = this_02;
  (*pCVar2->_vptr_ChIntegrable[0x1a])
            ((this->super_ChTimestepperIIorder).super_ChTimestepper.T,dt,pCVar2,this_01,this_02,y,
             this_00,0,0);
  ChStateDelta::operator*(&local_90,this_00,dt);
  chrono::operator+((ChState *)&local_70,y,&local_90);
  ChState::operator=(y,(ChState *)&local_70);
  Eigen::internal::handmade_aligned_free
            (local_70.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_data);
  Eigen::internal::handmade_aligned_free
            (local_90.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  ChStateDelta::operator*(&local_48,this_01,dt);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_70,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,(type *)0x0);
  ChStateDelta::operator+(&local_90,this_00,&local_70);
  ChStateDelta::operator=(this_00,&local_90);
  Eigen::internal::handmade_aligned_free
            (local_90.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_70.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_48.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  *pdVar1 = dt + *pdVar1;
  (*pCVar2->_vptr_ChIntegrable[0x17])(pCVar2,y,this_00,1);
  (*pCVar2->_vptr_ChIntegrable[0x19])(pCVar2,this_01);
  (*pCVar2->_vptr_ChIntegrable[9])(pCVar2,local_78);
  return;
}

Assistant:

void ChTimestepperEulerExplIIorder::Advance(const double dt) {
    // downcast
    ChIntegrableIIorder* mintegrable = (ChIntegrableIIorder*)this->integrable;

    // setup main vectors
    mintegrable->StateSetup(X, V, A);

    // setup auxiliary vectors
    Dv.setZero(mintegrable->GetNcoords_v(), GetIntegrable());
    L.setZero(mintegrable->GetNconstr());

    mintegrable->StateGather(X, V, T);  // state <- system

    mintegrable->StateSolveA(A, L, X, V, T, dt, false, false);  // Dv/dt = f(x,v,T)

    // Euler formula!

    X = X + V * dt;  // x_new= x + v * dt

    V = V + A * dt;  // v_new= v + a * dt

    T += dt;

    mintegrable->StateScatter(X, V, T, true);  // state -> system
    mintegrable->StateScatterAcceleration(A);  // -> system auxiliary data
    mintegrable->StateScatterReactions(L);     // -> system auxiliary data
}